

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

void __thiscall edition_unittest::TestNestedRequiredForeign::Clear(TestNestedRequiredForeign *this)

{
  TestNestedRequiredForeign *this_00;
  TestRequiredForeign *this_01;
  TestRequiredEnum *this_02;
  TestRequiredEnumNoMask *this_03;
  TestRequiredEnumMulti *this_04;
  TestRequiredNoMaskMulti *this_05;
  anon_union_64_1_493b367e_for_TestNestedRequiredForeign_3 aVar1;
  Nonnull<const_char_*> failure_msg;
  int line;
  LogMessageFatal local_20;
  
  aVar1 = this->field_0;
  if (((undefined1  [64])aVar1 & (undefined1  [64])0x3f) != (undefined1  [64])0x0) {
    if (((undefined1  [64])aVar1 & (undefined1  [64])0x1) != (undefined1  [64])0x0) {
      this_00 = (this->field_0)._impl_.child_;
      if (this_00 == (TestNestedRequiredForeign *)0x0) {
        failure_msg = "_impl_.child_ != nullptr";
        line = 0x4ba4;
        goto LAB_00c29f54;
      }
      Clear(this_00);
    }
    if (((undefined1  [64])aVar1 & (undefined1  [64])0x2) != (undefined1  [64])0x0) {
      this_01 = (this->field_0)._impl_.payload_;
      if (this_01 == (TestRequiredForeign *)0x0) {
        failure_msg = "_impl_.payload_ != nullptr";
        line = 0x4ba8;
        goto LAB_00c29f54;
      }
      TestRequiredForeign::Clear(this_01);
    }
    if (((undefined1  [64])aVar1 & (undefined1  [64])0x4) != (undefined1  [64])0x0) {
      this_02 = (this->field_0)._impl_.required_enum_;
      if (this_02 == (TestRequiredEnum *)0x0) {
        failure_msg = "_impl_.required_enum_ != nullptr";
        line = 0x4bac;
        goto LAB_00c29f54;
      }
      TestRequiredEnum::Clear(this_02);
    }
    if (((undefined1  [64])aVar1 & (undefined1  [64])0x8) != (undefined1  [64])0x0) {
      this_03 = (this->field_0)._impl_.required_enum_no_mask_;
      if (this_03 == (TestRequiredEnumNoMask *)0x0) {
        failure_msg = "_impl_.required_enum_no_mask_ != nullptr";
        line = 0x4bb0;
        goto LAB_00c29f54;
      }
      TestRequiredEnumNoMask::Clear(this_03);
    }
    if (((undefined1  [64])aVar1 & (undefined1  [64])0x10) != (undefined1  [64])0x0) {
      this_04 = (this->field_0)._impl_.required_enum_multi_;
      if (this_04 == (TestRequiredEnumMulti *)0x0) {
        failure_msg = "_impl_.required_enum_multi_ != nullptr";
        line = 0x4bb4;
        goto LAB_00c29f54;
      }
      TestRequiredEnumMulti::Clear(this_04);
    }
    if (((undefined1  [64])aVar1 & (undefined1  [64])0x20) != (undefined1  [64])0x0) {
      this_05 = (this->field_0)._impl_.required_no_mask_;
      if (this_05 == (TestRequiredNoMaskMulti *)0x0) {
        failure_msg = "_impl_.required_no_mask_ != nullptr";
        line = 0x4bb8;
LAB_00c29f54:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_20,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/edition_unittest.pb.cc"
                   ,line,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
      }
      TestRequiredNoMaskMulti::Clear(this_05);
    }
  }
  (this->field_0)._impl_.dummy_ = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestNestedRequiredForeign::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.TestNestedRequiredForeign)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(_impl_.child_ != nullptr);
      _impl_.child_->Clear();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.payload_ != nullptr);
      _impl_.payload_->Clear();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(_impl_.required_enum_ != nullptr);
      _impl_.required_enum_->Clear();
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(_impl_.required_enum_no_mask_ != nullptr);
      _impl_.required_enum_no_mask_->Clear();
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(_impl_.required_enum_multi_ != nullptr);
      _impl_.required_enum_multi_->Clear();
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(_impl_.required_no_mask_ != nullptr);
      _impl_.required_no_mask_->Clear();
    }
  }
  _impl_.dummy_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}